

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesDeviceSetOverclockWaiver(zes_device_handle_t hDevice)

{
  zes_pfnDeviceSetOverclockWaiver_t pfnSetOverclockWaiver;
  ze_result_t result;
  zes_device_handle_t hDevice_local;
  
  pfnSetOverclockWaiver._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cab0 != (code *)0x0) {
    pfnSetOverclockWaiver._4_4_ = (*DAT_0011cab0)(hDevice);
  }
  return pfnSetOverclockWaiver._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceSetOverclockWaiver(
        zes_device_handle_t hDevice                     ///< [in] Sysman handle of the device.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetOverclockWaiver = context.zesDdiTable.Device.pfnSetOverclockWaiver;
        if( nullptr != pfnSetOverclockWaiver )
        {
            result = pfnSetOverclockWaiver( hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }